

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O3

void RegisterOutputScriptRPCCommands(CRPCTable *t)

{
  string category;
  string category_00;
  string category_01;
  string category_02;
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffff50;
  long in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterOutputScriptRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterOutputScriptRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"util","");
      category._M_string_length = in_stack_ffffffffffffff50;
      category._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff48;
      category.field_2._M_allocated_capacity = in_stack_ffffffffffffff58;
      category.field_2._8_8_ = in_stack_ffffffffffffff60;
      CRPCCommand::CRPCCommand
                (RegisterOutputScriptRPCCommands::commands,category,(RpcMethodFnType)local_58);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"util","");
      category_00._M_string_length = in_stack_ffffffffffffff50;
      category_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff48;
      category_00.field_2._M_allocated_capacity = in_stack_ffffffffffffff58;
      category_00.field_2._8_8_ = in_stack_ffffffffffffff60;
      CRPCCommand::CRPCCommand
                (RegisterOutputScriptRPCCommands::commands + 1,category_00,(RpcMethodFnType)local_78
                );
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"util","");
      category_01._M_string_length = in_stack_ffffffffffffff50;
      category_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff48;
      category_01.field_2._M_allocated_capacity = in_stack_ffffffffffffff58;
      category_01.field_2._8_8_ = in_stack_ffffffffffffff60;
      CRPCCommand::CRPCCommand
                (RegisterOutputScriptRPCCommands::commands + 2,category_01,(RpcMethodFnType)local_98
                );
      puVar3 = &stack0xffffffffffffff58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff48,"util","");
      category_02._M_string_length = in_stack_ffffffffffffff50;
      category_02._M_dataplus._M_p = puVar3;
      category_02.field_2._M_allocated_capacity = in_stack_ffffffffffffff58;
      category_02.field_2._8_8_ = in_stack_ffffffffffffff60;
      CRPCCommand::CRPCCommand
                (RegisterOutputScriptRPCCommands::commands + 3,category_02,
                 (RpcMethodFnType)&stack0xffffffffffffff48);
      if (puVar3 != &stack0xffffffffffffff58) {
        operator_delete(puVar3,in_stack_ffffffffffffff58 + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterOutputScriptRPCCommands(CRPCTable&)::commands);
    }
  }
  lVar2 = 0x200;
  pcmd = RegisterOutputScriptRPCCommands::commands;
  do {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
    lVar2 = lVar2 + -0x80;
  } while (lVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterOutputScriptRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"util", &validateaddress},
        {"util", &createmultisig},
        {"util", &deriveaddresses},
        {"util", &getdescriptorinfo},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}